

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraCec.c
# Opt level: O0

int Fra_FraigCecPartitioned
              (Aig_Man_t *pMan1,Aig_Man_t *pMan2,int nConfLimit,int nPartSize,int fSmart,
              int fVerbose)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  Vec_Ptr_t *p;
  uint local_44;
  int local_40;
  int nOutputs;
  int RetValue;
  int i;
  Vec_Ptr_t *vParts;
  Aig_Man_t *pAig;
  int fVerbose_local;
  int fSmart_local;
  int nPartSize_local;
  int nConfLimit_local;
  Aig_Man_t *pMan2_local;
  Aig_Man_t *pMan1_local;
  
  local_40 = 1;
  pAig._0_4_ = fVerbose;
  pAig._4_4_ = fSmart;
  fVerbose_local = nPartSize;
  fSmart_local = nConfLimit;
  _nPartSize_local = pMan2;
  pMan2_local = pMan1;
  p = Aig_ManMiterPartitioned(pMan1,pMan2,nPartSize,fSmart);
  local_44 = 0xffffffff;
  for (nOutputs = 0; iVar1 = Vec_PtrSize(p), nOutputs < iVar1; nOutputs = nOutputs + 1) {
    vParts = (Vec_Ptr_t *)Vec_PtrEntry(p,nOutputs);
    local_44 = local_44 + 1;
    if ((int)pAig != 0) {
      uVar5 = Vec_PtrSize(p);
      uVar2 = Aig_ManCiNum((Aig_Man_t *)vParts);
      uVar3 = Aig_ManCoNum((Aig_Man_t *)vParts);
      uVar4 = Aig_ManNodeNum((Aig_Man_t *)vParts);
      iVar1 = Aig_ManLevelNum((Aig_Man_t *)vParts);
      printf("Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r",
             (ulong)(nOutputs + 1),(ulong)uVar5,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,iVar1);
      fflush(_stdout);
    }
    local_40 = Fra_FraigMiterStatus((Aig_Man_t *)vParts);
    if (local_40 != 1) {
      if (local_40 == 0) break;
      local_40 = Fra_FraigCec((Aig_Man_t **)&vParts,fSmart_local,0);
      Vec_PtrWriteEntry(p,nOutputs,vParts);
      if (local_40 != 1) break;
    }
  }
  if ((int)pAig != 0) {
    printf(
          "                                                                                          \r"
          );
    fflush(_stdout);
  }
  if (local_40 == -1) {
    uVar5 = Vec_PtrSize(p);
    printf("Timed out after verifying %d partitions (out of %d).\n",(ulong)local_44,(ulong)uVar5);
    fflush(_stdout);
  }
  for (nOutputs = 0; iVar1 = Vec_PtrSize(p), nOutputs < iVar1; nOutputs = nOutputs + 1) {
    vParts = (Vec_Ptr_t *)Vec_PtrEntry(p,nOutputs);
    Aig_ManStop((Aig_Man_t *)vParts);
  }
  Vec_PtrFree(p);
  return local_40;
}

Assistant:

int Fra_FraigCecPartitioned( Aig_Man_t * pMan1, Aig_Man_t * pMan2, int nConfLimit, int nPartSize, int fSmart, int fVerbose )
{
    Aig_Man_t * pAig;
    Vec_Ptr_t * vParts;
    int i, RetValue = 1, nOutputs;
    // create partitions
    vParts = Aig_ManMiterPartitioned( pMan1, pMan2, nPartSize, fSmart );
    // solve the partitions
    nOutputs = -1;
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
    {
        nOutputs++;
        if ( fVerbose )
        {
            printf( "Verifying part %4d  (out of %4d)  PI = %5d. PO = %5d. And = %6d. Lev = %4d.\r", 
                i+1, Vec_PtrSize(vParts), Aig_ManCiNum(pAig), Aig_ManCoNum(pAig), 
                Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
            fflush( stdout );
        }
        RetValue = Fra_FraigMiterStatus( pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        RetValue = Fra_FraigCec( &pAig, nConfLimit, 0 );
        Vec_PtrWriteEntry( vParts, i, pAig );
        if ( RetValue == 1 )
            continue;
        if ( RetValue == 0 )
            break;
        break;
    }
    // clear the result
    if ( fVerbose )
    {
        printf( "                                                                                          \r" );
        fflush( stdout );
    }
    // report the timeout
    if ( RetValue == -1 )
    {
        printf( "Timed out after verifying %d partitions (out of %d).\n", nOutputs, Vec_PtrSize(vParts) );
        fflush( stdout );
    }
    // free intermediate results
    Vec_PtrForEachEntry( Aig_Man_t *, vParts, pAig, i )
        Aig_ManStop( pAig );
    Vec_PtrFree( vParts );
    return RetValue;
}